

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O2

void helics::detail::convertFromBinary(byte *data,double *val)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = getDataSize(data);
  if (sVar1 != 0 && val != (double *)0x0) {
    memcpy(val,data + 8,sVar1 * 8);
  }
  if ((*data & 1) != 0) {
    for (lVar2 = sVar1 << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
      checks::swapBytes<8ul>((byte *)val);
      val = val + 1;
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, double* val)
{
    const std::size_t size = getDataSize(data);
    if (val != nullptr && size > 0) {
        std::memcpy(val, data + 8, size * sizeof(double));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        double* currentVal = val;
        double* end = currentVal + size;
        while (currentVal != end) {
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(currentVal++));
        }
    }
}